

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O3

ssize_t __thiscall
mprpc::MpRpcServer::send(MpRpcServer *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  undefined1 *puVar4;
  undefined4 in_register_00000034;
  undefined8 *puVar5;
  size_t len;
  size_t local_30;
  
  puVar5 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  iVar1 = (**(code **)(*(long *)*puVar5 + 0x18))();
  if (__n < (ulong)(long)iVar1) {
    sVar3 = (**(code **)(*(long *)*puVar5 + 0x20))((long *)*puVar5,__buf,__n);
    return sVar3;
  }
  local_30 = snappy::MaxCompressedLength(__n);
  puVar4 = (undefined1 *)operator_new__(local_30 + 5);
  *puVar4 = 0x53;
  *(int *)(puVar4 + 1) = (int)__n;
  snappy::RawCompress((char *)__buf,__n,puVar4 + 5,&local_30);
  uVar2 = (**(code **)(*(long *)*puVar5 + 0x20))((long *)*puVar5,puVar4,local_30 + 5);
  operator_delete__(puVar4);
  return (ulong)uVar2;
}

Assistant:

bool MpRpcServer::send(shared_ptr<ClientConnection> conn, const void* data, size_t size)
    {
        if (size < (size_t)conn->max_raw_size()) {
            return conn->send((const char*)data, size);
        }
        else {
            //static uint64_t time1;
            //static uint64_t time2;
            //static uint64_t count;
            //auto begin_time = system_clock::now();

            size_t len = snappy::MaxCompressedLength(size);
            char* buf = new char[5 + len];
            buf[0] = 'S';
            *(uint32_t*)(buf + 1) = (uint32_t)size;
            snappy::RawCompress((const char*)data, size, buf + 5, &len);

            //time1 += duration_cast<microseconds>(system_clock::now() - begin_time).count();

            bool r = conn->send (buf, len + 5);
            delete[] buf;

            //time2 += duration_cast<microseconds>(system_clock::now() - begin_time).count();

            //count++;
            //if (count == 20) {
            //    std::cout << "send time: " << (time1 / count) << "," << (time2 / count) << endl;
            //    time1 = time2 = 0;
            //    count = 0;
            //}

            return r;
        }
    }